

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O0

set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> * __thiscall
MNS::Response::getHeaderNames(Response *this)

{
  bool bVar1;
  set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *in_RSI;
  set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *in_RDI;
  pair<std::_Rb_tree_const_iterator<const_char_*>,_bool> pVar2;
  iterator headerItem;
  set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *headerNames;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff84;
  _Self local_28;
  _Self local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::set
            ((set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_> *)0x1204f5);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::begin(in_stack_ffffffffffffff78);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(in_stack_ffffffffffffff78);
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x12053a);
    std::__cxx11::string::c_str();
    pVar2 = std::set<const_char_*,_std::less<const_char_*>,_std::allocator<const_char_*>_>::insert
                      (in_RSI,(value_type *)in_RDI);
    in_stack_ffffffffffffff84 = CONCAT13(pVar2.second,(int3)in_stack_ffffffffffffff84);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)pVar2.first._M_node._M_node,in_stack_ffffffffffffff84);
  }
  return in_RDI;
}

Assistant:

std::set<const char *> MNS::Response::getHeaderNames() {
	std::set<const char*> headerNames;
	for(auto headerItem = this->headers.begin(); headerItem != this->headers.end(); headerItem++) {
		headerNames.insert(headerItem->first.c_str());
	}

	return headerNames;
}